

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontFamily.cpp
# Opt level: O3

FontFaceHandleDefault * __thiscall
Rml::FontFamily::GetFaceHandle(FontFamily *this,FontStyle style,FontWeight weight,int size)

{
  FontStyle FVar1;
  FontWeight FVar2;
  int iVar3;
  pointer pFVar4;
  FontFaceHandleDefault *pFVar5;
  long lVar6;
  FontFace *pFVar7;
  ulong uVar8;
  int iVar9;
  FontFace *this_00;
  
  pFVar4 = (this->font_faces).
           super__Vector_base<Rml::FontFamily::FontFaceEntry,_std::allocator<Rml::FontFamily::FontFaceEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->font_faces).
      super__Vector_base<Rml::FontFamily::FontFaceEntry,_std::allocator<Rml::FontFamily::FontFaceEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar4) {
    iVar9 = 0x7fffffff;
    lVar6 = 0;
    uVar8 = 0;
    pFVar7 = (FontFace *)0x0;
    do {
      this_00 = *(FontFace **)
                 ((long)&(pFVar4->face)._M_t.
                         super___uniq_ptr_impl<Rml::FontFace,_std::default_delete<Rml::FontFace>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_Rml::FontFace_*,_std::default_delete<Rml::FontFace>_>
                         .super__Head_base<0UL,_Rml::FontFace_*,_false>._M_head_impl + lVar6);
      FVar1 = FontFace::GetStyle(this_00);
      if (FVar1 == style) {
        FVar2 = FontFace::GetWeight(this_00);
        iVar3 = Math::Absolute((uint)FVar2 - (uint)weight);
        if (iVar3 < iVar9) {
          iVar9 = iVar3;
          pFVar7 = this_00;
        }
        if (iVar3 == 0) break;
      }
      uVar8 = uVar8 + 1;
      pFVar4 = (this->font_faces).
               super__Vector_base<Rml::FontFamily::FontFaceEntry,_std::allocator<Rml::FontFamily::FontFaceEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
      this_00 = pFVar7;
    } while (uVar8 < (ulong)((long)(this->font_faces).
                                   super__Vector_base<Rml::FontFamily::FontFaceEntry,_std::allocator<Rml::FontFamily::FontFaceEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar4 >> 4));
    if (this_00 != (FontFace *)0x0) {
      pFVar5 = FontFace::GetHandle(this_00,size,true);
      return pFVar5;
    }
  }
  return (FontFaceHandleDefault *)0x0;
}

Assistant:

FontFaceHandleDefault* FontFamily::GetFaceHandle(Style::FontStyle style, Style::FontWeight weight, int size)
{
	int best_dist = INT_MAX;
	FontFace* matching_face = nullptr;
	for (size_t i = 0; i < font_faces.size(); i++)
	{
		FontFace* face = font_faces[i].face.get();

		if (face->GetStyle() == style)
		{
			const int dist = Math::Absolute((int)face->GetWeight() - (int)weight);
			if (dist == 0)
			{
				// Direct match for weight, break the loop early.
				matching_face = face;
				break;
			}
			else if (dist < best_dist)
			{
				// Best match so far for weight, store the face and dist.
				matching_face = face;
				best_dist = dist;
			}
		}
	}

	if (!matching_face)
		return nullptr;

	return matching_face->GetHandle(size, true);
}